

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O0

bool Assimp::IFC::ProcessCurve(IfcCurve *curve,TempMesh *meshout,ConversionData *conv)

{
  bool bVar1;
  Curve *__p;
  pointer pCVar2;
  size_type sVar3;
  CurveError *local_3b8;
  value_type_conflict4 local_3a4 [105];
  CurveError *cv_1;
  BoundedCurve *bc;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  format local_1a8;
  unique_ptr<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>_> local_30;
  unique_ptr<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>_> cv;
  ConversionData *conv_local;
  TempMesh *meshout_local;
  IfcCurve *curve_local;
  
  cv._M_t.
  super___uniq_ptr_impl<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_Assimp::IFC::Curve_*,_std::default_delete<const_Assimp::IFC::Curve>_>
  .super__Head_base<0UL,_const_Assimp::IFC::Curve_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>,_true,_true>
        )(__uniq_ptr_data<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>,_true,_true>
          )conv;
  __p = Curve::Convert(curve,conv);
  std::unique_ptr<Assimp::IFC::Curve_const,std::default_delete<Assimp::IFC::Curve_const>>::
  unique_ptr<std::default_delete<Assimp::IFC::Curve_const>,void>
            ((unique_ptr<Assimp::IFC::Curve_const,std::default_delete<Assimp::IFC::Curve_const>> *)
             &local_30,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar1) {
    pCVar2 = std::
             unique_ptr<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>_>::
             get(&local_30);
    if (pCVar2 == (pointer)0x0) {
      local_3b8 = (CurveError *)0x0;
    }
    else {
      local_3b8 = (CurveError *)__dynamic_cast(pCVar2,&Curve::typeinfo,&BoundedCurve::typeinfo,0);
    }
    cv_1 = local_3b8;
    if (local_3b8 == (CurveError *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogError("cannot use unbounded curve as profile");
      curve_local._7_1_ = false;
    }
    else {
      BoundedCurve::SampleDiscrete((BoundedCurve *)local_3b8,meshout);
      sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        (&meshout->mVerts);
      local_3a4[0] = (value_type_conflict4)sVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&meshout->mVertcnt,local_3a4);
      curve_local._7_1_ = true;
    }
  }
  else {
    STEP::Object::GetClassName_abi_cxx11_
              (&local_1e8,
               (Object *)
               ((long)&(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                       _vptr_ObjectHelper +
               (long)(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper[-3]));
    std::operator+(&local_1c8,"skipping unknown IfcCurve entity, type is ",&local_1e8);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
               &local_1c8);
    LogFunctions<Assimp::IFCImporter>::LogWarn(&local_1a8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    curve_local._7_1_ = false;
  }
  bc._0_4_ = 1;
  std::unique_ptr<const_Assimp::IFC::Curve,_std::default_delete<const_Assimp::IFC::Curve>_>::
  ~unique_ptr(&local_30);
  return curve_local._7_1_;
}

Assistant:

bool ProcessCurve(const Schema_2x3::IfcCurve& curve,  TempMesh& meshout, ConversionData& conv)
{
    std::unique_ptr<const Curve> cv(Curve::Convert(curve,conv));
    if (!cv) {
        IFCImporter::LogWarn("skipping unknown IfcCurve entity, type is " + curve.GetClassName());
        return false;
    }

    // we must have a bounded curve at this point
    if (const BoundedCurve* bc = dynamic_cast<const BoundedCurve*>(cv.get())) {
        try {
            bc->SampleDiscrete(meshout);
        }
        catch(const  CurveError& cv) {
            IFCImporter::LogError(cv.mStr + " (error occurred while processing curve)");
            return false;
        }
        meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
        return true;
    }

    IFCImporter::LogError("cannot use unbounded curve as profile");
    return false;
}